

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * google::CheckstrcasecmpfalseImpl_abi_cxx11_(char *s1,char *s2,char *names)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  ostringstream ss;
  bool equal;
  byte local_1ae;
  byte local_1ad;
  ostream local_1a0;
  byte local_21;
  char *local_20;
  char *local_18;
  char *local_10;
  string *local_8;
  
  local_1ad = 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI != in_RSI) {
    local_1ae = 0;
    if ((in_RDI != (char *)0x0) && (local_1ae = 0, in_RSI != (char *)0x0)) {
      iVar1 = strcasecmp(in_RDI,in_RSI);
      local_1ae = iVar1 != 0 ^ 0xff;
    }
    local_1ad = local_1ae;
  }
  local_21 = local_1ad & 1;
  if (local_21 == 0) {
    local_8 = (string *)0x0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    if (local_10 == (char *)0x0) {
      local_10 = "";
    }
    if (local_18 == (char *)0x0) {
      local_18 = "";
    }
    poVar2 = std::operator<<(&local_1a0,"CHECK_STRCASENE failed: ");
    poVar2 = std::operator<<(poVar2,local_20);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = std::operator<<(poVar2,local_10);
    poVar2 = std::operator<<(poVar2," vs. ");
    poVar2 = std::operator<<(poVar2,local_18);
    std::operator<<(poVar2,")");
    psVar3 = (string *)operator_new(0x124c1f);
    std::__cxx11::ostringstream::str();
    local_8 = psVar3;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  }
  return local_8;
}

Assistant:

int posix_strerror_r(int err, char *buf, size_t len) {
  // Sanity check input parameters
  if (buf == NULL || len <= 0) {
    errno = EINVAL;
    return -1;
  }

  // Reset buf and errno, and try calling whatever version of strerror_r()
  // is implemented by glibc
  buf[0] = '\000';
  int old_errno = errno;
  errno = 0;
  char *rc = reinterpret_cast<char *>(strerror_r(err, buf, len));

  // Both versions set errno on failure
  if (errno) {
    // Should already be there, but better safe than sorry
    buf[0]     = '\000';
    return -1;
  }
  errno = old_errno;

  // POSIX is vague about whether the string will be terminated, although
  // is indirectly implies that typically ERANGE will be returned, instead
  // of truncating the string. This is different from the GNU implementation.
  // We play it safe by always terminating the string explicitly.
  buf[len-1] = '\000';

  // If the function succeeded, we can use its exit code to determine the
  // semantics implemented by glibc
  if (!rc) {
    return 0;
  } else {
    // GNU semantics detected
    if (rc == buf) {
      return 0;
    } else {
      buf[0] = '\000';
#if defined(OS_MACOSX) || defined(OS_FREEBSD) || defined(OS_OPENBSD)
      if (reinterpret_cast<intptr_t>(rc) < sys_nerr) {
        // This means an error on MacOSX or FreeBSD.
        return -1;
      }
#endif
      strncat(buf, rc, len-1);
      return 0;
    }
  }
}